

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O2

void reversed_copy(int N,v4sf *in,int in_stride,v4sf *out)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  undefined4 in_register_00000014;
  float *pfVar11;
  float *pfVar12;
  v4sf *pafVar13;
  float fVar14;
  float fVar15;
  
  pfVar11 = (float *)CONCAT44(in_register_00000014,in_stride);
  fVar1 = (*in)[0];
  fVar2 = (*in)[1];
  fVar14 = (*in)[3];
  fVar3 = in[1][0];
  fVar4 = in[1][1];
  fVar5 = in[1][2];
  fVar15 = in[1][3];
  pfVar11[-4] = (*in)[2];
  pfVar11[-3] = fVar5;
  pfVar11[-2] = fVar2;
  pfVar11[-1] = fVar4;
  pafVar13 = in + 9;
  iVar10 = 1;
  while( true ) {
    pfVar12 = pfVar11 + -8;
    if (N <= iVar10) break;
    fVar2 = pafVar13[-1][1];
    fVar4 = pafVar13[-1][2];
    fVar5 = pafVar13[-1][3];
    fVar6 = (*pafVar13)[0];
    fVar7 = (*pafVar13)[1];
    fVar8 = (*pafVar13)[2];
    fVar9 = (*pafVar13)[3];
    *pfVar12 = pafVar13[-1][0];
    pfVar11[-7] = fVar6;
    pfVar11[-6] = fVar14;
    pfVar11[-5] = fVar15;
    pfVar11[-0xc] = fVar4;
    pfVar11[-0xb] = fVar8;
    pfVar11[-10] = fVar2;
    pfVar11[-9] = fVar7;
    iVar10 = iVar10 + 1;
    pafVar13 = pafVar13 + 8;
    fVar14 = fVar5;
    fVar15 = fVar9;
    pfVar11 = pfVar12;
  }
  *pfVar12 = fVar1;
  pfVar11[-7] = fVar3;
  pfVar11[-6] = fVar14;
  pfVar11[-5] = fVar15;
  return;
}

Assistant:

static void reversed_copy(int N, const v4sf *in, int in_stride, v4sf *out) {
  v4sf g0, g1;
  int k;
  INTERLEAVE2(in[0], in[1], g0, g1); in += in_stride;
  
  *--out = VSWAPHL(g0, g1); // [g0l, g0h], [g1l g1h] -> [g1l, g0h]
  for (k=1; k < N; ++k) {
    v4sf h0, h1;
    INTERLEAVE2(in[0], in[1], h0, h1); in += in_stride;
    *--out = VSWAPHL(g1, h0);
    *--out = VSWAPHL(h0, h1);
    g1 = h1;
  }
  *--out = VSWAPHL(g1, g0);
}